

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O3

void __thiscall QTextHtmlParser::parseCloseTag(QTextHtmlParser *this)

{
  uint uVar1;
  int iVar2;
  char16_t *pcVar3;
  QTextHtmlParserNode *pQVar4;
  undefined1 *puVar5;
  QTextHtmlParserNode **ppQVar6;
  long lVar7;
  storage_type_conflict *psVar8;
  char cVar9;
  int iVar10;
  pointer ppQVar11;
  iterator iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long in_FS_OFFSET;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QString local_88;
  QArrayData *local_70 [3];
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->pos = this->pos + 1;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  parseWord(&local_88,this);
  QString::toLower_helper((QString *)local_70);
  QString::trimmed_helper((QString *)&local_58);
  if (local_70[0] != (QArrayData *)0x0) {
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70[0],2,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar2 = this->pos;
  iVar10 = this->len;
  if (this->len < iVar2) {
    iVar10 = iVar2;
  }
  pcVar3 = (this->txt).d.ptr;
  lVar14 = 0;
  do {
    if ((long)iVar10 - (long)iVar2 == lVar14) break;
    this->pos = iVar2 + 1 + (int)lVar14;
    lVar7 = iVar2 + lVar14;
    lVar14 = lVar14 + 1;
  } while (pcVar3[lVar7] != L'>');
  iVar2 = (int)(this->nodes).d.size;
  uVar1 = iVar2 - 1;
  uVar15 = uVar1;
  if ((int)uVar1 < 1) {
LAB_0051028e:
    uVar13 = uVar15;
    if (uVar13 == 0) goto LAB_0051037b;
  }
  else {
    uVar15 = iVar2 - 2;
    pQVar4 = (this->nodes).d.ptr[uVar15];
    puVar5 = (undefined1 *)(pQVar4->tag).d.size;
    uVar13 = uVar1;
    if ((((puVar5 == local_48) &&
         (QVar16.m_data = (pQVar4->tag).d.ptr, QVar16.m_size = (qsizetype)puVar5,
         QVar18.m_data = psStack_50, QVar18.m_size = (qsizetype)puVar5,
         cVar9 = QtPrivate::equalStrings(QVar16,QVar18), cVar9 != '\0')) &&
        ((ulong)(uint)pQVar4->id < 0x39)) &&
       ((0x1000000e0000000U >> ((ulong)(uint)pQVar4->id & 0x3f) & 1) != 0)) goto LAB_0051028e;
  }
  puVar5 = local_48;
  psVar8 = psStack_50;
  ppQVar6 = (this->nodes).d.ptr;
  do {
    pQVar4 = ppQVar6[(int)uVar13];
    if (((undefined1 *)(pQVar4->tag).d.size == puVar5) &&
       (QVar17.m_data = (pQVar4->tag).d.ptr, QVar17.m_size = (qsizetype)puVar5,
       QVar19.m_data = psVar8, QVar19.m_size = (qsizetype)puVar5,
       cVar9 = QtPrivate::equalStrings(QVar17,QVar19), cVar9 != '\0')) {
      if ((((uint)pQVar4->wsm < 5) &&
          (((0x1aU >> (pQVar4->wsm & 0x1f) & 1) != 0 && ((pQVar4->field_0x91 & 0xe) == 0)))) &&
         (cVar9 = QString::endsWith((QChar)((short)ppQVar6[(int)uVar1] + L'\x18'),10), cVar9 != '\0'
         )) {
        lVar14 = (this->nodes).d.size;
        ppQVar11 = QList<QTextHtmlParserNode_*>::data(&this->nodes);
        QString::chop(*(long *)((long)ppQVar11 + ((lVar14 << 0x20) + -0x100000000 >> 0x1d)) + 0x18);
      }
      newNode(this,(this->nodes).d.ptr[(int)uVar13]->parent);
      iVar12 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      QTextHtmlParserNode::initializeProperties
                (iVar12.i[-1],(this->nodes).d.ptr[iVar12.i[-1]->parent],this);
      break;
    }
    uVar13 = pQVar4->parent;
  } while (uVar13 != 0);
LAB_0051037b:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parseCloseTag()
{
    ++pos;
    QString tag = parseWord().toLower().trimmed();
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'>')
            break;
    }

    // find corresponding open node
    int p = last();
    if (p > 0
        && at(p - 1).tag == tag
        && at(p - 1).mayNotHaveChildren())
        p--;

    while (p && at(p).tag != tag)
        p = at(p).parent;

    // simply ignore the tag if we can't find
    // a corresponding open node, for broken
    // html such as <font>blah</font></font>
    if (!p)
        return;

    // in a white-space preserving environment strip off a trailing newline
    // since the closing of the opening block element will automatically result
    // in a new block for elements following the <pre>
    // ...foo\n</pre><p>blah -> foo</pre><p>blah
    if ((at(p).wsm == QTextHtmlParserNode::WhiteSpacePre
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreWrap
         || at(p).wsm == QTextHtmlParserNode::WhiteSpacePreLine)
        && at(p).isBlock()) {
        if (at(last()).text.endsWith(u'\n'))
            nodes[last()]->text.chop(1);
    }

    newNode(at(p).parent);
    resolveNode();
}